

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMatrix.cpp
# Opt level: O0

void testMatrix33ArrayConstructor(float (*a) [3])

{
  bool bVar1;
  float (*in_RDI) [3];
  M33f m;
  Matrix33<float> local_50;
  Matrix33<float> local_2c;
  
  Imath_3_2::Matrix33<float>::Matrix33(&local_2c,in_RDI);
  Imath_3_2::Matrix33<float>::Matrix33(&local_50);
  bVar1 = Imath_3_2::Matrix33<float>::operator==(&local_2c,&local_50);
  if (!bVar1) {
    __assert_fail("m == IMATH_INTERNAL_NAMESPACE::M33f()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testMatrix.cpp"
                  ,0x30,"void testMatrix33ArrayConstructor(const float (*)[3])");
  }
  return;
}

Assistant:

void
testMatrix33ArrayConstructor(const float a[3][3])
{
    IMATH_INTERNAL_NAMESPACE::M33f m(a);
    assert(m == IMATH_INTERNAL_NAMESPACE::M33f());
}